

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cc
# Opt level: O3

void __thiscall brown::Simulator::renderLoop(Simulator *this,Tile *dd)

{
  uintptr_t uVar1;
  bool bVar2;
  uint32_t uVar3;
  uint uVar4;
  uint32_t *puVar5;
  char *pcVar6;
  int64_t iVar7;
  long lVar8;
  ulong uVar9;
  size_t sVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  App *this_00;
  float fVar19;
  int mousx;
  int dmousy;
  int dmousx;
  int bstatus;
  int mousy;
  int local_64;
  App *local_60;
  float local_54;
  int local_50;
  int local_4c;
  Tile *local_48;
  Simulator *local_40;
  byte local_38 [4];
  int local_34;
  
  uVar13 = this->BMPYRES;
  uVar14 = dd->y;
  if ((int)uVar13 <= dd->y) {
    uVar14 = uVar13;
  }
  uVar16 = (ulong)uVar14;
  this_00 = this->app;
  if (0 < (int)uVar14) {
    local_60 = this->app;
    local_48 = dd;
    local_40 = this;
    do {
      iVar15 = (int)uVar16;
      uVar16 = (long)iVar15 - 1;
      uVar13 = local_40->BMPXRES;
      if (local_48->x < local_40->BMPXRES) {
        uVar13 = local_48->x;
      }
      if (0 < (int)uVar13) {
        iVar17 = local_48->p;
        uVar1 = local_48->f;
        uVar12 = (ulong)uVar13 + 1;
        do {
          uVar13 = uVar13 - 1;
          puVar5 = Tile::getpix(&this->drawing,uVar13,(int)uVar16);
          *(uint32_t *)((long)iVar17 * uVar16 + uVar1 + -8 + uVar12 * 4) = *puVar5;
          uVar12 = uVar12 - 1;
        } while (1 < uVar12);
      }
    } while (1 < iVar15);
    uVar13 = local_40->BMPYRES;
    dd = local_48;
    this = local_40;
    this_00 = local_60;
  }
  Tile::drawrectfill(dd,this->BMPXRES,0,dd->x,uVar13,0);
  Tile::drawrectfill(dd,0,this->BMPYRES,dd->x,dd->y,0);
  uVar3 = 0xff0000;
  if (this->odown != false) {
    uVar3 = 0xff00;
  }
  Tile::drawcirc(dd,(this->BMPXRES >> 1) + (this->acur[0] >> 6),
                 (this->BMPYRES >> 1) + (this->acur[1] >> 6),0x14,uVar3);
  sVar10 = this->fifn;
  Tile::print6x8(dd,0,0,0xffffff,0,"%.2f sec, fifn=%d",(double)this->pclk / (double)this->CLKFRQ,
                 sVar10);
  pcVar6 = App::getKeyStatus(this_00);
  App::getMouseStatus(this_00,&local_64,&local_34,&local_4c,&local_50,(int *)local_38);
  renderLoop::otim = renderLoop::tim;
  uVar3 = App::getTime(this_00);
  renderLoop::tim = (double)uVar3 * 0.001;
  lVar18 = this->zoom;
  lVar8 = (long)((double)this->xoff +
                (double)(((long)pcVar6[0xcd] - (long)pcVar6[0xcb]) * lVar18 * 0x200) *
                (renderLoop::tim - renderLoop::otim));
  this->xoff = lVar8;
  iVar7 = lVar18;
  if ((local_38[0] & 2) != 0) {
    lVar11 = (local_50 * lVar18) / 100 + lVar18;
    iVar15 = 100;
    if (100 < lVar11) {
      iVar15 = (int)lVar11;
    }
    renderLoop::i = 10000000;
    if (lVar11 < 10000000) {
      renderLoop::i = iVar15;
    }
    iVar7 = (int64_t)renderLoop::i;
    lVar8 = lVar8 + (long)local_64 * (lVar18 - iVar7) + local_4c * lVar18;
    this->xoff = lVar8;
    this->zoom = iVar7;
  }
  uVar13 = this->fault;
  if (uVar13 != 0) {
    iVar15 = (int)((this->faultclk - lVar8) / iVar7);
    if ((uVar13 & 0xfffffffe) == 2) {
      sVar10 = CONCAT44((int)(sVar10 >> 0x20),uVar13) & 0xffffffff00000001 | 0x78;
      Tile::print6x8(dd,iVar15,0x25d,0xff8080,0,"fault: %c div by 0",sVar10);
      uVar13 = this->fault;
    }
    if ((uVar13 & 0xfffffffe) == 4) {
      sVar10 = CONCAT44((int)(sVar10 >> 0x20),uVar13) & 0xffffffff00000001 | 0x78;
      Tile::print6x8(dd,iVar15,0x25d,0xff8080,0,"fault: %c dir change at hi veloc",sVar10);
      uVar13 = this->fault;
    }
    if ((uVar13 & 0xfffffffe) == 6) {
      sVar10 = CONCAT44((int)(sVar10 >> 0x20),uVar13) & 0xffffffff00000001 | 0x78;
      Tile::print6x8(dd,iVar15,0x25d,0xff8080,0,"fault: %c veloc too high",sVar10);
      uVar13 = this->fault;
    }
    if ((uVar13 & 0xfffffffe) == 8) {
      sVar10 = CONCAT44((int)(sVar10 >> 0x20),uVar13) | 0x78;
      Tile::print6x8(dd,iVar15,0x25d,0xff8080,0,"fault: %c accel too high",sVar10);
    }
    Tile::drawline(dd,(float)iVar15,615.0,(float)iVar15,815.0,0xff8080);
    lVar8 = this->xoff;
    iVar7 = this->zoom;
  }
  lVar18 = this->fifclk[this->fifn - 1];
  renderLoop::i = 0;
  do {
    Tile::drawrectfill(dd,-(int)(lVar8 / iVar7),renderLoop::i * 0x28 + 0x267,
                       (int)((lVar18 - lVar8) / iVar7),renderLoop::i * 0x28 + 0x285,0x404040);
    bVar2 = renderLoop::i < 4;
    renderLoop::i = renderLoop::i + 1;
  } while (bVar2);
  renderLoop::dpx = -1;
  renderLoop::dpy = -1;
  renderLoop::rzoom =
       SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x40000000)) / SEXT816(this->zoom),0) << 2;
  renderLoop::i = 0;
  uVar16 = this->fifn;
  iVar15 = 0;
  if (uVar16 != 0) {
    uVar12 = 0;
    iVar15 = 0;
    do {
      uVar9 = (ulong)(uint)renderLoop::i;
      lVar18 = (this->fifclk[uVar12] - this->xoff) * renderLoop::rzoom;
      if (-1 < lVar18) {
        iVar17 = (int)((ulong)lVar18 >> 0x20);
        if ((renderLoop::dpx < iVar17) && ((this->fifbit[uVar12] & 1U) != 0)) {
          renderLoop::dpx = iVar17;
          Tile::drawline(dd,(float)iVar17,615.0,(float)iVar17,645.0,0xffffff);
          uVar9 = (ulong)(uint)renderLoop::i;
        }
        if ((renderLoop::dpy < iVar17) && ((this->fifbit[(int)uVar9] & 2U) != 0)) {
          renderLoop::dpy = iVar17;
          Tile::drawline(dd,(float)iVar17,695.0,(float)iVar17,725.0,0xffffff);
          uVar9 = (ulong)(uint)renderLoop::i;
        }
        if (0 < (int)uVar9) {
          local_54 = (float)iVar15;
          fVar19 = (float)(int)(((byte)this->fifbit[uVar9 - 1] >> 2 & 1) * -0x1e + 0x2ad);
          local_60 = (App *)CONCAT44(local_60._4_4_,(float)iVar17);
          Tile::drawline(dd,local_54,fVar19,(float)iVar17,fVar19,0xffffff);
          Tile::drawline(dd,local_60._0_4_,
                         (float)(int)(((byte)this->fifbit[(long)renderLoop::i + -1] >> 2 & 1) *
                                      -0x1e + 0x2ad),local_60._0_4_,
                         (float)(int)(((byte)this->fifbit[renderLoop::i] >> 2 & 1) * -0x1e + 0x2ad),
                         0xffffff);
          fVar19 = (float)(int)(((byte)this->fifbit[(long)renderLoop::i + -1] >> 3 & 1) * -0x1e +
                               0x2fd);
          Tile::drawline(dd,local_54,fVar19,local_60._0_4_,fVar19,0xffffff);
          Tile::drawline(dd,local_60._0_4_,
                         (float)(int)(((byte)this->fifbit[(long)renderLoop::i + -1] >> 3 & 1) *
                                      -0x1e + 0x2fd),local_60._0_4_,
                         (float)(int)(((byte)this->fifbit[renderLoop::i] >> 3 & 1) * -0x1e + 0x2fd),
                         0xffffff);
          fVar19 = (float)(int)(((byte)this->fifbit[(long)renderLoop::i + -1] >> 4 & 1) * -0x1e +
                               0x325);
          Tile::drawline(dd,local_54,fVar19,local_60._0_4_,fVar19,0xffffff);
          Tile::drawline(dd,local_60._0_4_,
                         (float)(int)(((byte)this->fifbit[(long)renderLoop::i + -1] >> 4 & 1) *
                                      -0x1e + 0x325),local_60._0_4_,
                         (float)(int)(((byte)this->fifbit[renderLoop::i] >> 4 & 1) * -0x1e + 0x325),
                         0xffffff);
        }
        uVar16 = this->fifn;
        iVar15 = iVar17;
        if (dd->x <= iVar17) break;
      }
      renderLoop::i = renderLoop::i + 1;
      uVar12 = (ulong)renderLoop::i;
    } while (uVar12 < uVar16);
    if (uVar16 == 0) {
      iVar15 = 0;
    }
    else {
      uVar12 = 0;
      do {
        if ((long)local_64 * this->zoom + this->xoff <= this->fifclk[uVar12]) {
          renderLoop::i = (int)uVar12;
          uVar3 = 0xff00;
          if ((this->fifbit[uVar12] & 0x10U) == 0) {
            uVar3 = 0xff0000;
          }
          Tile::drawcirc(dd,(this->BMPXRES >> 1) + (this->fifcurx[uVar12] >> 6),
                         (this->BMPYRES >> 1) + (this->fifcury[uVar12] >> 6),5,uVar3);
          uVar16 = (ulong)renderLoop::i;
          iVar15 = 1;
          if (renderLoop::i < 1) {
            iVar15 = renderLoop::i;
          }
          pcVar6 = this->fifbit;
          uVar13 = iVar15 - 1;
          uVar12 = (ulong)(uint)renderLoop::i;
          uVar14 = renderLoop::i;
          goto LAB_00104a3a;
        }
        uVar12 = uVar12 + 1;
      } while (uVar16 != uVar12);
      iVar15 = (int)uVar16;
    }
  }
  goto LAB_0010488b;
  while (uVar12 = (ulong)((int)uVar12 - 1), (pcVar6[uVar14] & 1U) == 0) {
LAB_00104a3a:
    uVar14 = uVar14 - 1;
    if ((int)uVar12 < 2) {
      bVar2 = 0 < renderLoop::i;
      uVar12 = (ulong)uVar13;
      goto LAB_00104a5e;
    }
  }
  bVar2 = true;
LAB_00104a5e:
  for (; (uVar16 < this->fifn - 1 && ((pcVar6[uVar16] & 1U) == 0)); uVar16 = uVar16 + 1) {
  }
  uVar4 = renderLoop::i;
  uVar14 = renderLoop::i;
  if (bVar2) {
    Tile::drawline(dd,(float)((this->fifclk[uVar12] - this->xoff) / this->zoom),628.0,
                   (float)((this->fifclk[uVar16] - this->xoff) / this->zoom),628.0,0x808080);
    sVar10 = this->fifclk[uVar16] - this->fifclk[uVar12];
    Tile::print6x8(dd,local_64 + 2,0x26c,0xffffff,0,"%d clk",sVar10);
    Tile::print6x8(dd,local_64 + 2,0x276,0xffffff,0,"(%.1f Hz)",
                   (double)this->CLKFRQ / (double)(this->fifclk[uVar16] - this->fifclk[uVar12]));
    pcVar6 = this->fifbit;
    iVar15 = 1;
    if (renderLoop::i < 1) {
      iVar15 = renderLoop::i;
    }
    uVar13 = iVar15 - 1;
    uVar4 = renderLoop::i;
    uVar14 = renderLoop::i;
  }
  do {
    uVar14 = uVar14 - 1;
    if ((int)uVar4 < 2) {
      bVar2 = 0 < iVar15;
      goto LAB_00104b98;
    }
    uVar4 = uVar4 - 1;
  } while ((pcVar6[uVar14] & 2U) == 0);
  bVar2 = true;
  uVar13 = uVar4;
LAB_00104b98:
  for (uVar16 = (ulong)renderLoop::i; (uVar16 < this->fifn - 1 && ((pcVar6[uVar16] & 2U) == 0));
      uVar16 = uVar16 + 1) {
  }
  iVar15 = renderLoop::i;
  if (bVar2) {
    Tile::drawline(dd,(float)((this->fifclk[uVar13] - this->xoff) / this->zoom),708.0,
                   (float)((this->fifclk[uVar16] - this->xoff) / this->zoom),708.0,0x808080);
    sVar10 = this->fifclk[uVar16] - this->fifclk[uVar13];
    Tile::print6x8(dd,local_64 + 2,700,0xffffff,0,"%d clk",sVar10);
    Tile::print6x8(dd,local_64 + 2,0x2c6,0xffffff,0,"(%.1f Hz)",
                   (double)this->CLKFRQ / (double)(this->fifclk[uVar16] - this->fifclk[uVar13]));
    iVar15 = renderLoop::i;
  }
LAB_0010488b:
  renderLoop::i = iVar15;
  Tile::drawline(dd,(float)local_64,615.0,(float)local_64,815.0,0x406080);
  Tile::print6x8(dd,local_64,0x25f,0xffffff,0,"%.6f sec",
                 (double)((long)local_64 * this->zoom + this->xoff) / (double)this->CLKFRQ,sVar10);
  Tile::print6x8(dd,5,0x274,0xffffff,0,"X Pulse:");
  Tile::print6x8(dd,5,0x29c,0xffffff,0,"X Dir:");
  Tile::print6x8(dd,5,0x2c4,0xffffff,0,"Y Pulse:");
  Tile::print6x8(dd,5,0x2ec,0xffffff,0,"Y Dir:");
  Tile::print6x8(dd,5,0x314,0xffffff,0,"Pen Down:");
  return;
}

Assistant:

void Simulator::renderLoop(Tile& dd) {
    App& app = *this->app;

    /* Copy drawing to texture */
    for(int y = min(dd.gety(),BMPYRES)-1; y >= 0; y--) {
        uint32_t* wptr = reinterpret_cast<uint32_t*>(dd.getp()*y + dd.getf());
        for(int x = min(dd.getx(),BMPXRES)-1; x >= 0; x--) {
            wptr[x] = drawing.getpix(x, y);
        }
    }

    /* Fill in the blank */
    dd.drawrectfill(BMPXRES, 0, dd.getx(), BMPYRES, BACKGROUND_COLOR);
    dd.drawrectfill(0, BMPYRES, dd.getx(), dd.gety(), BACKGROUND_COLOR);

    /* Draw pen location */
    if (!odown) {
        dd.drawcirc((acur[0]>>6)+(BMPXRES>>1), (acur[1]>>6)+(BMPYRES>>1), 20, UP_LOC_COLOR);
    } else {
        dd.drawcirc((acur[0]>>6)+(BMPXRES>>1), (acur[1]>>6)+(BMPYRES>>1), 20, DOWN_LOC_COLOR);
    }

    /* Show timing info */
    dd.print6x8(0,0,0xffffff,BACKGROUND_COLOR,"%.2f sec, fifn=%d",(double)pclk/CLKFRQ,fifn);

#if ENABLE_SCOPE
    /* Scope, timing plot */
    static int64_t rzoom;
    static double tim = 0.0, otim, dtim;
    static int i, dpx, dpy;

    // Get app status
    const char* keystatus = app.getKeyStatus();
    int mousx, mousy, dmousx, dmousy, bstatus;
    app.getMouseStatus(mousx, mousy, dmousx, dmousy, bstatus);

    // Pan left/right with arrow keys
    otim = tim;
    tim = static_cast<double>(app.getTime())*.001;
    dtim = tim-otim;
    xoff += (keystatus[0xcd]-keystatus[0xcb])*zoom*512*dtim;

    // Zoom and pan with mouse
    if (bstatus & 1<<1) { // right mouse botton down
        // pan
        xoff += dmousx * zoom;
        // zoom
        i = min(max(zoom+(zoom*dmousy)/100,100),10000000);
        xoff += (zoom-i)*mousx;
        zoom = i;
    }

    // Error message
    if (fault) {
        int x = (faultclk-xoff)/zoom;
        if ((fault>>1) == 1) dd.print6x8(x,YOFF-10,0xff8080,FONT_B_COLOR,"fault: %c div by 0",(fault&1)+'x');
        if ((fault>>1) == 2) dd.print6x8(x,YOFF-10,0xff8080,FONT_B_COLOR,"fault: %c dir change at hi veloc",(fault&1)+'x');
        if ((fault>>1) == 3) dd.print6x8(x,YOFF-10,0xff8080,FONT_B_COLOR,"fault: %c veloc too high",(fault&1)+'x');
        if ((fault>>1) == 4) dd.print6x8(x,YOFF-10,0xff8080,FONT_B_COLOR,"fault: %c accel too high",(fault&1)+'x');
        dd.drawline(x,YOFF,x,YOFF+200,0xff8080);
    }

    // Scope background
    int ox = (0-xoff)/zoom;
    int x  = (fifclk[fifn-1]-xoff)/zoom;
    for(i=0;i<5;i++) {
         dd.drawrectfill(ox,YOFF+i*40,x,YOFF+30+i*40,0x404040);
    }
    ox = 0; dpx = -1; dpy = -1;
    rzoom = (((1<<30)/zoom)<<2);

    // Scope data
     for(i=0;i<fifn;i++)
     {
         x = (((fifclk[i]-xoff)*rzoom)>>32); if (x < 0) continue;
         if ((x > dpx) && (fifbit[i]&1)) { dpx = x; dd.drawline(x,YOFF   ,x,YOFF+ 30,0xffffff); }
         if ((x > dpy) && (fifbit[i]&2)) { dpy = x; dd.drawline(x,YOFF+80,x,YOFF+110,0xffffff); }
         if (i > 0)
         {
             dd.drawline(ox,((fifbit[i-1]>>2)&1)*-30+YOFF+ 70,x,((fifbit[i-1]>>2)&1)*-30+YOFF+70,0xffffff);
             dd.drawline(x,((fifbit[i-1]>>2)&1)*-30+YOFF+ 70,x,((fifbit[i  ]>>2)&1)*-30+YOFF+70,0xffffff);

             dd.drawline(ox,((fifbit[i-1]>>3)&1)*-30+YOFF+150,x,((fifbit[i-1]>>3)&1)*-30+YOFF+150,0xffffff);
             dd.drawline( x,((fifbit[i-1]>>3)&1)*-30+YOFF+150,x,((fifbit[i  ]>>3)&1)*-30+YOFF+150,0xffffff);

             dd.drawline(ox,((fifbit[i-1]>>4)&1)*-30+YOFF+190,x,((fifbit[i-1]>>4)&1)*-30+YOFF+190,0xffffff);
             dd.drawline( x,((fifbit[i-1]>>4)&1)*-30+YOFF+190,x,((fifbit[i  ]>>4)&1)*-30+YOFF+190,0xffffff);
         }
         ox = x; if (x >= dd.getx()) break;
     }

    // Scope annotation
     for(i=0;i<fifn;i++)
     {
         if (fifclk[i] >= mousx*zoom + xoff)
         {
             int i0, i1;
             dd.drawcirc((fifcurx[i]>>6)+(BMPXRES>>1),(fifcury[i]>>6)+(BMPYRES>>1),5,
                (fifbit[i] & (1<<4))? DOWN_LOC_COLOR : UP_LOC_COLOR);

             for(i0=i-1;i0> 0    ;i0--) if (fifbit[i0]&1) break;
             for(i1=i  ;i1<fifn-1;i1++) if (fifbit[i1]&1) break;
             if (i0 >= 0)
             {
                 dd.drawline((fifclk[i0]-xoff)/zoom,YOFF+13,(fifclk[i1]-xoff)/zoom,YOFF+13,0x808080);
                 dd.print6x8(mousx+2,YOFF+ 5,FONT_F_COLOR,FONT_B_COLOR,"%d clk",fifclk[i1]-fifclk[i0]);
                 dd.print6x8(mousx+2,YOFF+15,FONT_F_COLOR,FONT_B_COLOR,"(%.1f Hz)",CLKFRQ/(double)(fifclk[i1]-fifclk[i0]));
             }

             for(i0=i-1;i0> 0    ;i0--) if (fifbit[i0]&2) break;
             for(i1=i  ;i1<fifn-1;i1++) if (fifbit[i1]&2) break;
             if (i0 >= 0)
             {
                 dd.drawline((fifclk[i0]-xoff)/zoom,YOFF+93,(fifclk[i1]-xoff)/zoom,YOFF+93,0x808080);
                 dd.print6x8(mousx+2,YOFF+85,FONT_F_COLOR,FONT_B_COLOR,"%d clk",fifclk[i1]-fifclk[i0]);
                 dd.print6x8(mousx+2,YOFF+95,FONT_F_COLOR,FONT_B_COLOR,"(%.1f Hz)",CLKFRQ/(double)(fifclk[i1]-fifclk[i0]));
             }

             break;
         }
    }

    // Scope time cursor
    dd.drawline(mousx,YOFF,mousx,YOFF+200,0x406080);
    dd.print6x8(mousx,YOFF - 8,FONT_F_COLOR,FONT_B_COLOR,"%.6f sec",(double)(mousx*zoom + xoff)/CLKFRQ);

    // Scope captions
    dd.print6x8(5, YOFF+ 13, FONT_F_COLOR, FONT_B_COLOR, "X Pulse:");
    dd.print6x8(5, YOFF+ 53, FONT_F_COLOR, FONT_B_COLOR, "X Dir:");
    dd.print6x8(5, YOFF+ 93, FONT_F_COLOR, FONT_B_COLOR, "Y Pulse:");
    dd.print6x8(5, YOFF+133, FONT_F_COLOR, FONT_B_COLOR, "Y Dir:");
    dd.print6x8(5, YOFF+173, FONT_F_COLOR, FONT_B_COLOR, "Pen Down:");
#endif // ENABLE_SCOPE
}